

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.hpp
# Opt level: O2

void __thiscall
primesieve::Vector<primesieve::SievingPrime_*,_std::allocator<primesieve::SievingPrime_*>_>::swap
          (Vector<primesieve::SievingPrime_*,_std::allocator<primesieve::SievingPrime_*>_> *this,
          Vector<primesieve::SievingPrime_*,_std::allocator<primesieve::SievingPrime_*>_> *other)

{
  SievingPrime **ppSVar1;
  SievingPrime **ppSVar2;
  SievingPrime **ppSVar3;
  SievingPrime **ppSVar4;
  
  ppSVar1 = this->capacity_;
  ppSVar2 = other->end_;
  ppSVar3 = this->array_;
  ppSVar4 = this->end_;
  this->array_ = other->array_;
  this->end_ = ppSVar2;
  this->capacity_ = other->capacity_;
  other->array_ = ppSVar3;
  other->end_ = ppSVar4;
  other->capacity_ = ppSVar1;
  return;
}

Assistant:

void swap(Vector& other) noexcept
  {
    T* tmp_array = array_;
    T* tmp_end = end_;
    T* tmp_capacity = capacity_;

    array_ = other.array_;
    end_ = other.end_;
    capacity_ = other.capacity_;

    other.array_ = tmp_array;
    other.end_ = tmp_end;
    other.capacity_ = tmp_capacity;
  }